

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void Catch::defaultListReporters
               (ostream *out,
               vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
               *descriptions,Verbosity verbosity)

{
  vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *pvVar1;
  bool bVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  Column *pCVar5;
  Column *pCVar6;
  ostream *poVar7;
  Column local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  Column local_100;
  Columns local_c8;
  Column local_a0;
  reference local_68;
  ReporterDescription *desc;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *__range1;
  __normal_iterator<const_Catch::ReporterDescription_*,_std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>_>
  local_30;
  long local_28;
  size_type maxNameLen;
  vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *pvStack_18;
  Verbosity verbosity_local;
  vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
  *descriptions_local;
  ostream *out_local;
  
  maxNameLen._4_4_ = verbosity;
  pvStack_18 = descriptions;
  descriptions_local =
       (vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *)out;
  std::operator<<(out,"Available reporters:\n");
  cVar3 = std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::
          begin(pvStack_18);
  cVar4 = std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::end
                    (pvStack_18);
  local_30 = std::
             max_element<__gnu_cxx::__normal_iterator<Catch::ReporterDescription_const*,std::vector<Catch::ReporterDescription,std::allocator<Catch::ReporterDescription>>>,Catch::defaultListReporters(std::ostream&,std::vector<Catch::ReporterDescription,std::allocator<Catch::ReporterDescription>>const&,Catch::Verbosity)::__0>
                       (cVar3._M_current,cVar4._M_current);
  __gnu_cxx::
  __normal_iterator<const_Catch::ReporterDescription_*,_std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>_>
  ::operator->(&local_30);
  local_28 = std::__cxx11::string::size();
  pvVar1 = pvStack_18;
  __end1 = std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::
           begin(pvStack_18);
  desc = (ReporterDescription *)
         std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::end
                   (pvVar1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Catch::ReporterDescription_*,_std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>_>
                                *)&desc);
    if (!bVar2) break;
    local_68 = __gnu_cxx::
               __normal_iterator<const_Catch::ReporterDescription_*,_std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>_>
               ::operator*(&__end1);
    pvVar1 = descriptions_local;
    if (maxNameLen._4_4_ == Quiet) {
      TextFlow::Column::Column(&local_a0,&local_68->name);
      pCVar5 = TextFlow::Column::indent(&local_a0,2);
      pCVar5 = TextFlow::Column::width(pCVar5,local_28 + 5);
      poVar7 = TextFlow::operator<<((ostream *)pvVar1,pCVar5);
      std::operator<<(poVar7,'\n');
      TextFlow::Column::~Column(&local_a0);
    }
    else {
      std::operator+(&local_120,&local_68->name,':');
      TextFlow::Column::Column(&local_100,&local_120);
      pCVar5 = TextFlow::Column::indent(&local_100,2);
      pCVar5 = TextFlow::Column::width(pCVar5,local_28 + 5);
      TextFlow::Column::Column(&local_158,&local_68->description);
      pCVar6 = TextFlow::Column::initialIndent(&local_158,0);
      pCVar6 = TextFlow::Column::indent(pCVar6,2);
      pCVar6 = TextFlow::Column::width(pCVar6,0x48 - local_28);
      TextFlow::Column::operator+(&local_c8,pCVar5,pCVar6);
      poVar7 = TextFlow::operator<<((ostream *)pvVar1,&local_c8);
      std::operator<<(poVar7,'\n');
      TextFlow::Columns::~Columns(&local_c8);
      TextFlow::Column::~Column(&local_158);
      TextFlow::Column::~Column(&local_100);
      std::__cxx11::string::~string((string *)&local_120);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::ReporterDescription_*,_std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>_>
    ::operator++(&__end1);
  }
  poVar7 = std::operator<<((ostream *)descriptions_local,'\n');
  std::ostream::operator<<(poVar7,std::flush<char,std::char_traits<char>>);
  return;
}

Assistant:

void
    defaultListReporters( std::ostream& out,
                          std::vector<ReporterDescription> const& descriptions,
                          Verbosity verbosity ) {
        out << "Available reporters:\n";
        const auto maxNameLen =
            std::max_element( descriptions.begin(),
                              descriptions.end(),
                              []( ReporterDescription const& lhs,
                                  ReporterDescription const& rhs ) {
                                  return lhs.name.size() < rhs.name.size();
                              } )
                ->name.size();

        for ( auto const& desc : descriptions ) {
            if ( verbosity == Verbosity::Quiet ) {
                out << TextFlow::Column( desc.name )
                           .indent( 2 )
                           .width( 5 + maxNameLen )
                    << '\n';
            } else {
                out << TextFlow::Column( desc.name + ':' )
                               .indent( 2 )
                               .width( 5 + maxNameLen ) +
                           TextFlow::Column( desc.description )
                               .initialIndent( 0 )
                               .indent( 2 )
                               .width( CATCH_CONFIG_CONSOLE_WIDTH - maxNameLen - 8 )
                    << '\n';
            }
        }
        out << '\n' << std::flush;
    }